

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O0

void __thiscall
so_5::disp::prio_one_thread::strictly_ordered::impl::demand_queue_t::push
          (demand_queue_t *this,queue_for_one_priority_t *subqueue,demand_unique_ptr_t *demand)

{
  type lock_00;
  unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  local_30;
  lock_guard_t local_28;
  lock_guard_t lock;
  demand_unique_ptr_t *demand_local;
  queue_for_one_priority_t *subqueue_local;
  demand_queue_t *this_local;
  
  lock.m_lock = (lock_t *)demand;
  lock_00 = std::
            unique_ptr<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
            ::operator*(&this->m_lock);
  mpsc_queue_traits::lock_guard_t::lock_guard_t(&local_28,lock_00);
  std::
  unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  ::unique_ptr(&local_30,demand);
  add_demand_to_queue(this,subqueue,&local_30);
  std::
  unique_ptr<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t,_std::default_delete<so_5::disp::prio_one_thread::strictly_ordered::impl::demand_t>_>
  ::~unique_ptr(&local_30);
  if (this->m_current_priority == (queue_for_one_priority_t *)0x0) {
    this->m_current_priority = subqueue;
    mpsc_queue_traits::lock_guard_t::notify_one(&local_28);
  }
  else if (this->m_current_priority < subqueue) {
    this->m_current_priority = subqueue;
  }
  mpsc_queue_traits::lock_guard_t::~lock_guard_t(&local_28);
  return;
}

Assistant:

void
		push(
			//! Subqueue for the demand.
			queue_for_one_priority_t * subqueue,
			//! Demand to be pushed.
			demand_unique_ptr_t demand )
			{
				queue_traits::lock_guard_t lock{ *m_lock };

				add_demand_to_queue( *subqueue, std::move( demand ) );

				if( !m_current_priority )
					{
						// Queue was empty. A sleeping working thread must
						// be notified.
						m_current_priority = subqueue;
						lock.notify_one();
					}
				else if( m_current_priority < subqueue )
					// New demand has greater priority than the previous.
					m_current_priority = subqueue;
			}